

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void AddHuffmanBits(uint symbol,uint length,uchar *bp,uchar **out,size_t *outsize)

{
  ulong uVar1;
  uchar *puVar2;
  uint uVar3;
  bool bVar4;
  
  if (length != 0) {
    uVar3 = length - 1;
    do {
      if (*bp == '\0') {
        uVar1 = *outsize;
        if ((uVar1 & uVar1 - 1) == 0) {
          if (uVar1 == 0) {
            puVar2 = (uchar *)malloc(1);
          }
          else {
            puVar2 = (uchar *)realloc(*out,uVar1 * 2);
          }
          *out = puVar2;
        }
        (*out)[*outsize] = '\0';
        *outsize = *outsize + 1;
      }
      (*out)[*outsize - 1] =
           (*out)[*outsize - 1] | ((symbol >> (uVar3 & 0x1f) & 1) != 0) << (*bp & 0x1f);
      *bp = *bp + 1 & 7;
      bVar4 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar4);
  }
  return;
}

Assistant:

static void AddHuffmanBits(unsigned symbol, unsigned length,
                           unsigned char* bp, unsigned char** out,
                           size_t* outsize) {
  /* TODO(lode): make more efficient (add more bits at once). */
  unsigned i;
  for (i = 0; i < length; i++) {
    unsigned bit = (symbol >> (length - i - 1)) & 1;
    if (*bp == 0) ZOPFLI_APPEND_DATA(0, out, outsize);
    (*out)[*outsize - 1] |= bit << *bp;
    *bp = (*bp + 1) & 7;
  }
}